

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_4x64_impl.h
# Opt level: O0

void secp256k1_scalar_inverse(secp256k1_scalar *r,secp256k1_scalar *x)

{
  int iVar1;
  int iVar2;
  int zero_in;
  secp256k1_modinv64_signed62 s;
  secp256k1_modinv64_modinfo *in_stack_00000088;
  secp256k1_modinv64_signed62 *in_stack_00000090;
  secp256k1_modinv64_signed62 *in_stack_ffffffffffffffd8;
  secp256k1_modinv64_signed62 *in_stack_ffffffffffffffe0;
  
  iVar1 = secp256k1_scalar_is_zero((secp256k1_scalar *)0x127cf8);
  secp256k1_scalar_verify((secp256k1_scalar *)0x127d06);
  secp256k1_scalar_to_signed62
            (in_stack_ffffffffffffffe0,(secp256k1_scalar *)in_stack_ffffffffffffffd8);
  secp256k1_modinv64(in_stack_00000090,in_stack_00000088);
  secp256k1_scalar_from_signed62
            ((secp256k1_scalar *)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  secp256k1_scalar_verify((secp256k1_scalar *)0x127d3f);
  iVar2 = secp256k1_scalar_is_zero((secp256k1_scalar *)0x127d49);
  if (iVar2 != iVar1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/scalar_4x64_impl.h"
            ,0x3d7,"test condition failed: secp256k1_scalar_is_zero(r) == zero_in");
    abort();
  }
  return;
}

Assistant:

static void secp256k1_scalar_inverse(secp256k1_scalar *r, const secp256k1_scalar *x) {
    secp256k1_modinv64_signed62 s;
#ifdef VERIFY
    int zero_in = secp256k1_scalar_is_zero(x);
#endif
    SECP256K1_SCALAR_VERIFY(x);

    secp256k1_scalar_to_signed62(&s, x);
    secp256k1_modinv64(&s, &secp256k1_const_modinfo_scalar);
    secp256k1_scalar_from_signed62(r, &s);

    SECP256K1_SCALAR_VERIFY(r);
    VERIFY_CHECK(secp256k1_scalar_is_zero(r) == zero_in);
}